

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.hpp
# Opt level: O0

VkPipelineCreateFlags2CreateInfo *
Fossilize::find_pnext<VkPipelineCreateFlags2CreateInfo>(VkStructureType type,void *pNext)

{
  VkBaseInStructure *sin;
  void *pNext_local;
  VkStructureType type_local;
  
  sin = (VkBaseInStructure *)pNext;
  while( true ) {
    if (sin == (VkBaseInStructure *)0x0) {
      return (VkPipelineCreateFlags2CreateInfo *)0x0;
    }
    if (sin->sType == type) break;
    sin = sin->pNext;
  }
  return (VkPipelineCreateFlags2CreateInfo *)sin;
}

Assistant:

static inline const T *find_pnext(VkStructureType type, const void *pNext)
{
	while (pNext != nullptr)
	{
		auto *sin = static_cast<const VkBaseInStructure *>(pNext);
		if (sin->sType == type)
			return static_cast<const T*>(pNext);

		pNext = sin->pNext;
	}

	return nullptr;
}